

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleIni.h
# Opt level: O2

SI_Error __thiscall
CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::LoadFile
          (CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_> *this,FILE *a_fpFile)

{
  int iVar1;
  SI_Error SVar2;
  size_t __n;
  char *a_pData;
  size_t sVar3;
  
  iVar1 = fseek((FILE *)a_fpFile,0,2);
  SVar2 = SI_FILE;
  if (iVar1 == 0) {
    __n = ftell((FILE *)a_fpFile);
    if (-1 < (long)__n) {
      if (__n == 0) {
        SVar2 = SI_OK;
      }
      else {
        a_pData = (char *)operator_new__(__n + 1);
        a_pData[__n] = '\0';
        fseek((FILE *)a_fpFile,0,0);
        sVar3 = fread(a_pData,1,__n,(FILE *)a_fpFile);
        if (sVar3 == __n) {
          SVar2 = LoadData(this,a_pData,__n);
        }
        else {
          SVar2 = SI_FILE;
        }
        operator_delete__(a_pData);
      }
    }
  }
  return SVar2;
}

Assistant:

SI_Error CSimpleIniTempl<SI_CHAR, SI_STRLESS, SI_CONVERTER>::LoadFile(FILE *a_fpFile) {
	// load the raw file data
	int retval = fseek(a_fpFile, 0, SEEK_END);
	if (retval != 0) {
		return SI_FILE;
	}
	long lSize = ftell(a_fpFile);
	if (lSize < 0) {
		return SI_FILE;
	}
	if (lSize == 0) {
		return SI_OK;
	}

	// allocate and ensure NULL terminated
	char *pData = new char[lSize + 1];
	if (!pData) {
		return SI_NOMEM;
	}
	pData[lSize] = 0;

	// load data into buffer
	fseek(a_fpFile, 0, SEEK_SET);
	size_t uRead = fread(pData, sizeof(char), lSize, a_fpFile);
	if (uRead != (size_t)lSize) {
		delete[] pData;
		return SI_FILE;
	}

	// convert the raw data to unicode
	SI_Error rc = LoadData(pData, uRead);
	delete[] pData;
	return rc;
}